

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

TFunction * __thiscall
glslang::TParseContext::findFunction400
          (TParseContext *this,TSourceLoc *loc,TFunction *call,bool *builtIn)

{
  bool bVar1;
  TSymbolTable *pTVar2;
  TSourceLoc *pTVar3;
  int iVar4;
  undefined4 extraout_var;
  TSymbol *pTVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TFunction *pTVar6;
  undefined4 extraout_var_02;
  char *pcVar7;
  bool tie;
  TVector<const_glslang::TFunction_*> candidateList;
  bool local_c1;
  TSourceLoc *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_> local_78;
  vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_> local_50;
  
  pTVar2 = (this->super_TParseContextBase).symbolTable;
  iVar4 = (*(call->super_TSymbol)._vptr_TSymbol[6])(call);
  pTVar5 = TSymbolTable::find(pTVar2,(TString *)CONCAT44(extraout_var,iVar4),builtIn,(bool *)0x0,
                              (int *)0x0);
  if (pTVar5 != (TSymbol *)0x0) {
    iVar4 = (*pTVar5->_vptr_TSymbol[7])(pTVar5);
    return (TFunction *)CONCAT44(extraout_var_00,iVar4);
  }
  local_78.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  local_78.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0 = loc;
  local_78.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
  local_78.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar2 = (this->super_TParseContextBase).symbolTable;
  iVar4 = (*(call->super_TSymbol)._vptr_TSymbol[6])(call);
  TSymbolTable::findFunctionNameList
            (pTVar2,(TString *)CONCAT44(extraout_var_01,iVar4),
             (TVector<const_glslang::TFunction_*> *)&local_78,builtIn);
  bVar1 = *builtIn;
  local_c1 = false;
  std::vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>::
  vector(&local_50,&local_78);
  local_b8._9_7_ = 0;
  local_b8._M_pod_data[8] = bVar1;
  pcStack_a0 = std::
               _Function_handler<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp:7551:30)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp:7551:30)>
             ::_M_manager;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp:7587:25)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp:7587:25)>
             ::_M_manager;
  local_b8._M_unused._M_object = this;
  pTVar6 = TParseContextBase::selectFunction
                     (&this->super_TParseContextBase,
                      (TVector<const_glslang::TFunction_*> *)&local_50,call,
                      (function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_glslang::TOperator,_int)>
                       *)&local_b8,
                      (function<bool_(const_glslang::TType_&,_const_glslang::TType_&,_const_glslang::TType_&)>
                       *)&local_98,&local_c1);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  pTVar3 = local_c0;
  if (pTVar6 == (TFunction *)0x0) {
    pcVar7 = "no matching overloaded function found";
  }
  else {
    if (local_c1 != true) {
      return pTVar6;
    }
    pcVar7 = "ambiguous best function under implicit type conversion";
  }
  iVar4 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,pTVar3,pcVar7,*(undefined8 *)(CONCAT44(extraout_var_02,iVar4) + 8),"");
  return pTVar6;
}

Assistant:

const TFunction* TParseContext::findFunction400(const TSourceLoc& loc, const TFunction& call, bool& builtIn)
{
    // first, look for an exact match
    TSymbol* symbol = symbolTable.find(call.getMangledName(), &builtIn);
    if (symbol)
        return symbol->getAsFunction();

    // no exact match, use the generic selector, parameterized by the GLSL rules

    // create list of candidates to send
    TVector<const TFunction*> candidateList;
    symbolTable.findFunctionNameList(call.getMangledName(), candidateList, builtIn);

    // can 'from' convert to 'to'?
    const auto convertible = [this,builtIn](const TType& from, const TType& to, TOperator op, int param) -> bool {
        if (from == to)
            return true;
        if (from.coopMatParameterOK(to))
            return true;
        if (from.tensorParameterOK(to))
            return true;
        if (from.getBasicType() == EbtFunction && to.getBasicType() == EbtFunction)
            return true;
        if (from.coopVecParameterOK(to))
            return true;
        // Allow a sized array to be passed through an unsized array parameter, for coopMatLoad/Store functions
        if (builtIn && from.isArray() && to.isUnsizedArray()) {
            TType fromElementType(from, 0);
            TType toElementType(to, 0);
            // Load/store tensor functions allow any element type for the pointer
            if ((op == EOpCooperativeMatrixLoadTensorNV || op == EOpCooperativeMatrixStoreTensorNV) &&
                param == 1 &&
                (from.getQualifier().storage == EvqBuffer || from.getQualifier().storage == EvqShared)) {
                return true;
            }
            if (fromElementType == toElementType)
                return true;
        }
        if (from.isArray() || to.isArray() || ! from.sameElementShape(to))
            return false;
        if (from.isCoopMat() && to.isCoopMat())
            return from.sameCoopMatBaseType(to);
        if (from.isCoopVecNV() && to.isCoopVecNV())
            return from.sameCoopVecBaseType(to);
        return intermediate.canImplicitlyPromote(from.getBasicType(), to.getBasicType());
    };

    // Is 'to2' a better conversion than 'to1'?
    // Ties should not be considered as better.
    // Assumes 'convertible' already said true.
    const auto better = [](const TType& from, const TType& to1, const TType& to2) -> bool {
        // 1. exact match
        if (from == to2)
            return from != to1;
        if (from == to1)
            return false;

        // 2. float -> double is better
        if (from.getBasicType() == EbtFloat) {
            if (to2.getBasicType() == EbtDouble && to1.getBasicType() != EbtDouble)
                return true;
        }

        // 3. -> float is better than -> double
        return to2.getBasicType() == EbtFloat && to1.getBasicType() == EbtDouble;
    };

    // for ambiguity reporting
    bool tie = false;

    // send to the generic selector
    const TFunction* bestMatch = selectFunction(candidateList, call, convertible, better, tie);

    if (bestMatch == nullptr)
        error(loc, "no matching overloaded function found", call.getName().c_str(), "");
    else if (tie)
        error(loc, "ambiguous best function under implicit type conversion", call.getName().c_str(), "");

    return bestMatch;
}